

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.h
# Opt level: O1

bool __thiscall Js::JavascriptStackWalker::IsBailedOutFromFunction(JavascriptStackWalker *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  
  if ((((*(ushort *)&this->field_0x50 & 4) == 0 & ((byte)*(ushort *)&this->field_0x50 ^ 1)) != 0) ||
     (this->interpreterFrame == (InterpreterStackFrame *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptStackWalker.h"
                                ,0xd0,"(this->IsJavascriptFrame() && this->interpreterFrame)",
                                "this->IsJavascriptFrame() && this->interpreterFrame");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  BVar3 = JavascriptFunction::IsNativeAddress(this->scriptContext,(this->currentFrame).codeAddr);
  return BVar3 != 0;
}

Assistant:

bool IsBailedOutFromFunction() const
        {
            Assert(this->IsJavascriptFrame() && this->interpreterFrame);
            return !!JavascriptFunction::IsNativeAddress(this->scriptContext, this->currentFrame.GetInstructionPointer());
        }